

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O1

void __thiscall Assimp::PlyExporter::~PlyExporter(PlyExporter *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->endl)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->endl).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename).field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::ios_base::~ios_base((ios_base *)&this->field_0x70);
  return;
}

Assistant:

PlyExporter::~PlyExporter() {
    // empty
}